

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_collapse.c
# Opt level: O2

REF_STATUS ref_collapse_edge_ratio(REF_GRID ref_grid,REF_INT node0,REF_INT node1,REF_BOOL *allowed)

{
  REF_NODE ref_node;
  REF_CELL ref_cell;
  REF_ADJ pRVar1;
  REF_ADJ_ITEM pRVar2;
  bool bVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  undefined8 uVar8;
  long lVar9;
  REF_INT cell;
  int iVar10;
  char *pcVar11;
  double local_e8;
  double local_e0;
  double local_d8;
  double local_d0;
  REF_DBL edge_ratio;
  REF_BOOL *local_c0;
  ulong local_b8;
  REF_GRID local_b0;
  REF_INT nodes [27];
  
  ref_node = ref_grid->node;
  *allowed = 0;
  if (ref_grid->surf == 0) {
    lVar9 = 0x28;
    if (ref_grid->twod == 0) {
      lVar9 = 0x50;
    }
  }
  else {
    lVar9 = 0x28;
  }
  ref_cell = *(REF_CELL *)((long)ref_grid->cell + lVar9 + -0x10);
  uVar5 = 0xffffffff;
  cell = -1;
  if (-1 < node1) {
    pRVar1 = ref_cell->ref_adj;
    uVar5 = 0xffffffff;
    cell = -1;
    if (node1 < pRVar1->nnode) {
      uVar4 = pRVar1->first[(uint)node1];
      uVar5 = 0xffffffff;
      cell = -1;
      if ((long)(int)uVar4 != -1) {
        cell = pRVar1->item[(int)uVar4].ref;
        uVar5 = (ulong)uVar4;
      }
    }
  }
  local_d8 = -1.0;
  local_e8 = -1.0;
  local_d0 = 1e+200;
  local_e0 = 1e+200;
  local_c0 = allowed;
  local_b0 = ref_grid;
  while( true ) {
    if ((int)uVar5 == -1) {
      if ((local_b0->adapt->post_min_ratio <= local_e0) &&
         (local_e8 <= local_b0->adapt->post_max_ratio)) {
        *local_c0 = 1;
      }
      if ((local_d0 <= local_e0) && (local_e8 <= local_d8)) {
        *local_c0 = 1;
      }
      return 0;
    }
    uVar4 = ref_cell_nodes(ref_cell,cell,nodes);
    if (uVar4 != 0) break;
    lVar9 = 0;
    local_b8 = uVar5;
    while( true ) {
      uVar4 = ref_cell->node_per;
      uVar5 = (ulong)(int)uVar4;
      if ((long)uVar5 <= lVar9) break;
      if (nodes[lVar9] != node1) {
        uVar4 = ref_node_ratio(ref_node,node1,nodes[lVar9],&edge_ratio);
        if (uVar4 != 0) {
          pcVar11 = "ratio";
          uVar8 = 0x37f;
          goto LAB_00190274;
        }
        if (local_d8 <= edge_ratio) {
          local_d8 = edge_ratio;
        }
        if (edge_ratio <= local_d0) {
          local_d0 = edge_ratio;
        }
      }
      lVar9 = lVar9 + 1;
    }
    uVar6 = 0;
    uVar7 = 0;
    if (0 < (int)uVar4) {
      uVar7 = (ulong)uVar4;
    }
    bVar3 = false;
    iVar10 = (int)local_b8;
    for (; uVar7 != uVar6; uVar6 = uVar6 + 1) {
      if (nodes[uVar6] == node0) {
        bVar3 = true;
      }
    }
    if (!bVar3) {
      for (lVar9 = 0; lVar9 < (int)uVar5; lVar9 = lVar9 + 1) {
        if (nodes[lVar9] != node1) {
          uVar4 = ref_node_ratio(ref_node,node0,nodes[lVar9],&edge_ratio);
          if (uVar4 != 0) {
            pcVar11 = "ratio";
            uVar8 = 0x38c;
            goto LAB_00190274;
          }
          if (local_e8 <= edge_ratio) {
            local_e8 = edge_ratio;
          }
          if (edge_ratio <= local_e0) {
            local_e0 = edge_ratio;
          }
          uVar5 = (ulong)(uint)ref_cell->node_per;
        }
      }
      iVar10 = (int)local_b8;
    }
    pRVar2 = ref_cell->ref_adj->item;
    uVar5 = (ulong)pRVar2[iVar10].next;
    cell = -1;
    if (uVar5 != 0xffffffffffffffff) {
      cell = pRVar2[uVar5].ref;
    }
  }
  pcVar11 = "nodes";
  uVar8 = 0x37b;
LAB_00190274:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c",uVar8,
         "ref_collapse_edge_ratio",(ulong)uVar4,pcVar11);
  return uVar4;
}

Assistant:

REF_FCN REF_STATUS ref_collapse_edge_ratio(REF_GRID ref_grid, REF_INT node0,
                                           REF_INT node1, REF_BOOL *allowed) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell;
  REF_INT item, cell, nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT node;
  REF_BOOL will_be_collapsed;
  REF_DBL edge_ratio;
  REF_DBL old_max, old_min, new_max, new_min;

  *allowed = REF_FALSE;

  if (ref_grid_surf(ref_grid) || ref_grid_twod(ref_grid)) {
    ref_cell = ref_grid_tri(ref_grid);
  } else {
    ref_cell = ref_grid_tet(ref_grid);
  }

  old_max = -1.0;
  old_min = REF_DBL_MAX;
  new_max = -1.0;
  new_min = REF_DBL_MAX;
  each_ref_cell_having_node(ref_cell, node1, item, cell) {
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "nodes");

    for (node = 0; node < ref_cell_node_per(ref_cell); node++) {
      if (node1 != nodes[node]) {
        RSS(ref_node_ratio(ref_node, node1, nodes[node], &edge_ratio), "ratio");
        old_max = MAX(old_max, edge_ratio);
        old_min = MIN(old_min, edge_ratio);
      }
    }

    will_be_collapsed = REF_FALSE;
    for (node = 0; node < ref_cell_node_per(ref_cell); node++)
      if (node0 == nodes[node]) will_be_collapsed = REF_TRUE;
    if (will_be_collapsed) continue;

    for (node = 0; node < ref_cell_node_per(ref_cell); node++)
      if (node1 != nodes[node]) {
        RSS(ref_node_ratio(ref_node, node0, nodes[node], &edge_ratio), "ratio");
        new_max = MAX(new_max, edge_ratio);
        new_min = MIN(new_min, edge_ratio);
      }
  }

  if ((new_min >= ref_grid_adapt(ref_grid, post_min_ratio)) &&
      (new_max <= ref_grid_adapt(ref_grid, post_max_ratio))) {
    *allowed = REF_TRUE;
  }

  if (new_min >= old_min && new_max <= old_max) {
    *allowed = REF_TRUE;
  }

  return REF_SUCCESS;
}